

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O3

void __thiscall xmrig::SelfSelectClient::onHttpData(SelfSelectClient *this,HttpData *data)

{
  bool bVar1;
  int iVar2;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *pGVar3;
  undefined4 extraout_var;
  int64_t id;
  Type result;
  Value *error;
  char *pcVar4;
  Document doc;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  GStack_88;
  GenericStringStream<rapidjson::UTF8<char>_> local_28;
  
  if (data->status == 200) {
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::GenericDocument(&GStack_88,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                      (CrtAllocator *)0x0);
    local_28.src_ = (data->body)._M_dataplus._M_p;
    local_28.head_ = local_28.src_;
    pGVar3 = rapidjson::
             GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
             ::
             ParseStream<0u,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                       ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                         *)&GStack_88,&local_28);
    if ((pGVar3->parseResult_).code_ == kParseErrorNone) {
      id = Json::getInt64(&GStack_88.
                           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ,"id",-1);
      if ((id < 1) || (this->m_sequence - id == 1)) {
        result = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&GStack_88,"result");
        error = Json::getObject(&GStack_88.
                                 super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                ,"error");
        bVar1 = parseResponse(this,id,result,error);
        if (!bVar1) {
          setState(this,RetryState);
        }
      }
    }
    else {
      if ((this->m_quiet == false) && (this->m_failures < (long)this->m_retries)) {
        iVar2 = (*(this->super_IClient)._vptr_IClient[10])(this);
        if ((ulong)GStack_88.parseResult_.code_ < 0x12) {
          pcVar4 = &DAT_0018b828 + *(int *)(&DAT_0018b828 + (ulong)GStack_88.parseResult_.code_ * 4)
          ;
        }
        else {
          pcVar4 = "Unknown error.";
        }
        Log::print(ERR,"[%s] JSON decode failed: \"%s\"",
                   *(undefined8 *)(CONCAT44(extraout_var,iVar2) + 0x70),pcVar4);
      }
      setState(this,RetryState);
    }
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::~GenericDocument(&GStack_88);
    return;
  }
  setState(this,RetryState);
  return;
}

Assistant:

void xmrig::SelfSelectClient::onHttpData(const HttpData &data)
{
    if (data.status != HTTP_STATUS_OK) {
        return retry();
    }

    LOG_DEBUG("[%s] received (%d bytes): \"%.*s\"", pool().daemon().url().data(), static_cast<int>(data.body.size()), static_cast<int>(data.body.size()), data.body.c_str());

    rapidjson::Document doc;
    if (doc.Parse(data.body.c_str()).HasParseError()) {
        if (!isQuiet()) {
            LOG_ERR("[%s] JSON decode failed: \"%s\"",  pool().daemon().url().data(), rapidjson::GetParseError_En(doc.GetParseError()));
        }

        return retry();
    }

    const int64_t id = Json::getInt64(doc, "id", -1);
    if (id > 0 && m_sequence - id != 1) {
        return;
    }

    if (!parseResponse(id, doc["result"], Json::getObject(doc, "error"))) {
        retry();
    }
}